

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

float interpolate(vector<float,_std::allocator<float>_> *scale,
                 vector<float,_std::allocator<float>_> *values,float pos_in_scale)

{
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __last_00;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  LTError *pLVar4;
  const_reference pvVar5;
  reference pfVar6;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  float in_XMM0_Da;
  float fVar7;
  float weight;
  size_t idx;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> iter;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  float fVar8;
  anon_class_4_1_ceb98539_for__M_comp in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  value_type vVar9;
  undefined4 in_stack_ffffffffffffff54;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
  in_stack_ffffffffffffff58;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_80;
  float local_74;
  float *local_70;
  float *local_68;
  size_type local_60;
  float *local_58;
  float local_4c;
  float *local_48;
  float *local_40;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_38 [3];
  float local_1c;
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  value_type local_4;
  
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (bVar1) {
    pLVar4 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(pLVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTMain.cpp"
                     ,0x373,"interpolate",logFATAL,"ASSERT FAILED: %s","!scale.empty()");
    __cxa_throw(pLVar4,&LTError::typeinfo,LTError::~LTError);
  }
  sVar2 = std::vector<float,_std::allocator<float>_>::size(local_10);
  sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
  if (sVar2 != sVar3) {
    pLVar4 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(pLVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTMain.cpp"
                     ,0x374,"interpolate",logFATAL,"ASSERT FAILED: %s",
                     "scale.size() == values.size()");
    __cxa_throw(pLVar4,&LTError::typeinfo,LTError::~LTError);
  }
  sVar2 = std::vector<float,_std::allocator<float>_>::size(local_18);
  fVar8 = local_1c;
  if (sVar2 == 1) {
    pvVar5 = std::vector<float,_std::allocator<float>_>::front
                       ((vector<float,_std::allocator<float>_> *)
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    local_4 = *pvVar5;
  }
  else {
    pvVar5 = std::vector<float,_std::allocator<float>_>::front
                       ((vector<float,_std::allocator<float>_> *)
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    fVar7 = local_1c;
    if (*pvVar5 < fVar8) {
      pvVar5 = std::vector<float,_std::allocator<float>_>::back
                         ((vector<float,_std::allocator<float>_> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      if (fVar7 < *pvVar5) {
        local_40 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                      (in_stack_ffffffffffffff38);
        local_48 = (float *)std::vector<float,_std::allocator<float>_>::end
                                      (in_stack_ffffffffffffff38);
        local_4c = local_1c;
        __last_00._M_current._4_4_ = in_stack_ffffffffffffff54;
        __last_00._M_current._0_4_ = in_stack_ffffffffffffff50;
        local_38[0] = std::
                      adjacent_find<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,interpolate(std::vector<float,std::allocator<float>>const&,std::vector<float,std::allocator<float>>const&,float)::__0>
                                (in_stack_ffffffffffffff58,__last_00,in_stack_ffffffffffffff4c);
        local_58 = (float *)std::vector<float,_std::allocator<float>_>::end
                                      (in_stack_ffffffffffffff38);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                            *)in_stack_ffffffffffffff38);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          pLVar4 = (LTError *)__cxa_allocate_exception(0x18);
          LTError::LTError(pLVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTMain.cpp"
                           ,0x381,"interpolate",logFATAL,"ASSERT FAILED: %s","iter != scale.end()");
          __cxa_throw(pLVar4,&LTError::typeinfo,LTError::~LTError);
        }
        local_68 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                      (in_stack_ffffffffffffff38);
        local_70 = local_38[0]._M_current;
        __first._M_current._4_4_ = in_stack_ffffffffffffff54;
        __first._M_current._0_4_ = in_stack_ffffffffffffff50;
        __last._M_current._4_4_ = in_stack_ffffffffffffff4c.pos_in_scale;
        __last._M_current._0_4_ = in_stack_ffffffffffffff48;
        local_60 = std::
                   distance<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                             (__first,__last);
        pfVar6 = __gnu_cxx::
                 __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                 operator*(local_38);
        fVar7 = local_1c - *pfVar6;
        local_80 = __gnu_cxx::
                   __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                   operator+((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                              *)CONCAT44(fVar7,in_stack_ffffffffffffff48),
                             CONCAT44(local_1c,in_stack_ffffffffffffff40));
        pfVar6 = __gnu_cxx::
                 __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                 operator*(&local_80);
        fVar8 = *pfVar6;
        pfVar6 = __gnu_cxx::
                 __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                 operator*(local_38);
        local_74 = 1.0 - fVar7 / (fVar8 - *pfVar6);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_18,local_60);
        vVar9 = *pvVar5;
        fVar8 = local_74;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_18,local_60 + 1);
        local_4 = vVar9 * fVar8 + *pvVar5 * (1.0 - local_74);
      }
      else {
        pvVar5 = std::vector<float,_std::allocator<float>_>::back
                           ((vector<float,_std::allocator<float>_> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        local_4 = *pvVar5;
      }
    }
    else {
      pvVar5 = std::vector<float,_std::allocator<float>_>::front
                         ((vector<float,_std::allocator<float>_> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_4 = *pvVar5;
    }
  }
  return local_4;
}

Assistant:

float interpolate (const std::vector<float>& scale,
                   const std::vector<float>& values,
                   float pos_in_scale)
{
    LOG_ASSERT(!scale.empty());
    LOG_ASSERT(scale.size() == values.size());
    
    // Border Cases
    if (values.size() == 1) return values.front();
    if (pos_in_scale <= scale.front()) return values.front();
    if (pos_in_scale >= scale.back()) return values.back();
    
    // We now know that `pos_in_scale` is between front and back
    // Search for pos_in_scale in `scale`, find where it would fit inbetween
    // (as border cases are covered above must find something)
    const auto iter = std::adjacent_find(scale.begin(), scale.end(),
                                         [pos_in_scale](const float& a, const float& b)
                                         { return a <= pos_in_scale && pos_in_scale <= b; });
    LOG_ASSERT(iter != scale.end());

    // 'left' index and weight for 'left' value
    const size_t idx = (size_t)std::distance(scale.begin(), iter);
    const float weight = float(1) - (pos_in_scale - *iter)/(*(iter+1) - *iter);

    return                                  // interpolate between values of those positions we found
    values[idx]   * weight +                // 'left'-hand part
    values[idx+1] * (float(1) - weight);        // 'right'-hand part
}